

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisRegular.cpp
# Opt level: O3

void __thiscall KDIS::DATA_TYPE::GridAxisRegular::Decode(GridAxisRegular *this,KDataStream *stream)

{
  KException *this_00;
  KUINT16 KVar1;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0x17 < KVar1) {
    KDataStream::Read<double>(stream,(double *)&this->m_f64DomainInitialXi);
    KDataStream::Read<double>(stream,(double *)&this->m_f64DomainFinalXi);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16DomainPointsXi);
    KDataStream::Read(stream,&this->m_ui8InterleafFactor);
    KDataStream::Read(stream,&this->m_ui8AxisType);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16NumPoints);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16InitialIndex);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void GridAxisRegular::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < GRID_AXIS_REGULAR )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_f64DomainInitialXi
           >> m_f64DomainFinalXi
           >> m_ui16DomainPointsXi
           >> m_ui8InterleafFactor
           >> m_ui8AxisType
           >> m_ui16NumPoints
           >> m_ui16InitialIndex;
}